

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O0

void Assimp::PrefixString(aiString *string,char *prefix,uint len)

{
  Logger *this;
  uint len_local;
  char *prefix_local;
  aiString *string_local;
  
  if ((string->length == 0) || (string->data[0] != '$')) {
    if (len + string->length < 0x3ff) {
      memmove(string->data + len,string->data,(ulong)(string->length + 1));
      memcpy(string->data,prefix,(ulong)len);
      string->length = len + string->length;
    }
    else {
      this = DefaultLogger::get();
      Logger::debug(this,"Can\'t add an unique prefix because the string is too long");
    }
  }
  return;
}

Assistant:

inline
void PrefixString(aiString& string,const char* prefix, unsigned int len) {
    // If the string is already prefixed, we won't prefix it a second time
    if (string.length >= 1 && string.data[0] == '$')
        return;

    if (len+string.length>=MAXLEN-1) {
        ASSIMP_LOG_DEBUG("Can't add an unique prefix because the string is too long");
        ai_assert(false);
        return;
    }

    // Add the prefix
    ::memmove(string.data+len,string.data,string.length+1);
    ::memcpy (string.data, prefix, len);

    // And update the string's length
    string.length += len;
}